

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

string * testing::internal::OutputFlagAlsoCheckEnvVar_abi_cxx11_(void)

{
  char *__rhs;
  string *in_RDI;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,"",(allocator<char> *)&local_30);
  __rhs = getenv("XML_OUTPUT_FILE");
  if (__rhs != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"xml:",&local_51);
    std::operator+(&local_30,&local_50,__rhs);
    std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return in_RDI;
}

Assistant:

std::string OutputFlagAlsoCheckEnvVar(){
  std::string default_value_for_output_flag = "";
  const char* xml_output_file_env = posix::GetEnv("XML_OUTPUT_FILE");
  if (NULL != xml_output_file_env) {
    default_value_for_output_flag = std::string("xml:") + xml_output_file_env;
  }
  return default_value_for_output_flag;
}